

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::rsplit_path
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,libtorrent *this,string_view p)

{
  char *pcVar1;
  char *pcVar2;
  libtorrent *plVar3;
  libtorrent *plVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar5 = (char *)p._M_len;
  if (this == (libtorrent *)0x0) {
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    return __return_storage_ptr__;
  }
  if (((pcVar5 + -1)[(long)this] == '/') && (this = this + -1, this == (libtorrent *)0x0)) {
    this = (libtorrent *)0x0;
  }
  else {
    plVar3 = (libtorrent *)0x0;
    pcVar6 = pcVar5;
    while (plVar4 = plVar3, this != plVar4) {
      pcVar1 = pcVar6 + -1;
      pcVar2 = pcVar6 + -1;
      plVar3 = plVar4 + 1;
      pcVar6 = pcVar1;
      if (pcVar2[(long)this] == '/') {
        (__return_storage_ptr__->first)._M_len = (long)this - (long)(plVar4 + 1);
        (__return_storage_ptr__->first)._M_str = pcVar5;
        (__return_storage_ptr__->second)._M_len = (size_t)plVar4;
        (__return_storage_ptr__->second)._M_str = pcVar1 + (long)this + 1;
        return __return_storage_ptr__;
      }
    }
  }
  (__return_storage_ptr__->first)._M_len = 0;
  (__return_storage_ptr__->first)._M_str = (char *)0x0;
  (__return_storage_ptr__->second)._M_len = (size_t)this;
  (__return_storage_ptr__->second)._M_str = pcVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> rsplit_path(string_view p)
	{
		if (p.empty()) return {{}, {}};
		if (p.back() == TORRENT_SEPARATOR_CHAR) p.remove_suffix(1);
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		else if (p.back() == '/') p.remove_suffix(1);
#endif
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		auto const sep = p.find_last_of("/\\");
#else
		auto const sep = p.find_last_of(TORRENT_SEPARATOR_CHAR);
#endif
		if (sep == string_view::npos) return {{}, p};
		return { p.substr(0, sep), p.substr(sep + 1) };
	}